

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

bool __thiscall DiskTableNode::intersect(DiskTableNode *this,SSTableData *rhs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  SSTableHeader *pSVar4;
  bool bVar5;
  
  pSVar4 = SSTable::getHeader(this->_sstable);
  lVar1 = ((rhs->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
           super__Vector_impl_data._M_start)->key;
  lVar2 = (rhs->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
          super__Vector_impl_data._M_finish[-1].key;
  lVar3 = pSVar4->key_min;
  if (((lVar1 < lVar3) || (bVar5 = true, pSVar4->key_max < lVar1)) &&
     ((lVar2 < lVar3 || (bVar5 = true, pSVar4->key_max < lVar2)))) {
    if (lVar3 < lVar1) {
      bVar5 = false;
    }
    else {
      bVar5 = pSVar4->key_max <= lVar2;
    }
  }
  return bVar5;
}

Assistant:

bool DiskTableNode::intersect(SSTableData &rhs) {
    auto *h = getHeader();
    auto rkey_min = rhs.begin()->key;
    auto rkey_max = rhs.rbegin()->key;
    return ((rkey_min >= h->key_min && rkey_min <= h->key_max) ||
            (rkey_max >= h->key_min && rkey_max <= h->key_max)) ||
           (h->key_min >= rkey_min && h->key_max <= rkey_max);
}